

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O3

any * __thiscall
dap::any::operator=(any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val
                   )

{
  int iVar1;
  int iVar2;
  uintptr_t addr;
  TypeInfo *pTVar3;
  TypeInfo *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar6;
  uintptr_t ptr;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar5;
  
  pTVar4 = this->type;
  pTVar3 = TypeOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::type();
  if (pTVar4 == pTVar3) {
    std::__cxx11::string::_M_assign((string *)this->value);
  }
  else {
    if ((string *)this->value != (string *)0x0) {
      (*this->type->_vptr_TypeInfo[7])();
      if (this->value == (void *)0x0) {
        __assert_fail("value != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                      ,0xc3,"void dap::any::free()");
      }
      if (this->heap != (void *)0x0) {
        operator_delete__(this->heap);
        this->heap = (void *)0x0;
      }
    }
    this->value = (void *)0x0;
    this->type = (TypeInfo *)0x0;
    pTVar4 = TypeOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::type();
    this->type = pTVar4;
    iVar1 = (*pTVar4->_vptr_TypeInfo[3])(pTVar4);
    iVar2 = (*this->type->_vptr_TypeInfo[4])();
    uVar5 = CONCAT44(extraout_var_00,iVar2);
    if (this->value != (void *)0x0) {
      __assert_fail("value == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xb9,"void dap::any::alloc(size_t, size_t)");
    }
    puVar7 = this->buffer + (uVar5 - 1) + -((ulong)(this->buffer + (uVar5 - 1)) % uVar5);
    this->value = puVar7;
    if ((any *)(puVar7 + CONCAT44(extraout_var,iVar1) + -1) < this->buffer ||
        this + 1 <= (any *)(puVar7 + CONCAT44(extraout_var,iVar1) + -1)) {
      pvVar6 = operator_new__(CONCAT44(extraout_var,iVar1) + uVar5);
      this->heap = pvVar6;
      uVar8 = (uVar5 - 1) + (long)pvVar6;
      puVar7 = (uint8_t *)(uVar8 - uVar8 % uVar5);
      this->value = puVar7;
    }
    (*this->type->_vptr_TypeInfo[6])(this->type,puVar7,val);
  }
  return this;
}

Assistant:

any& any::operator=(const T& val) {
  if (!is<T>()) {
    reset();
    type = TypeOf<T>::type();
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, &val);
  } else {
#ifdef __clang_analyzer__
    assert(value != nullptr);
#endif
    *reinterpret_cast<T*>(value) = val;
  }
  return *this;
}